

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char*,char_const(&)[2],kj::String&>
          (String *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],
          String *params_2)

{
  char **value;
  char (*value_00) [2];
  String *value_01;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  String *local_28;
  String *params_local_2;
  char (*params_local_1) [2];
  char **params_local;
  
  local_28 = (String *)params_1;
  params_local_2 = (String *)params;
  params_local_1 = (char (*) [2])this;
  params_local = (char **)__return_storage_ptr__;
  value = fwd<char*>((NoInfer<char_*> *)this);
  local_38 = toCharSequence<char*>(value);
  value_00 = ::const((char (*) [2])params_local_2);
  local_48 = toCharSequence<char_const(&)[2]>(value_00);
  value_01 = fwd<kj::String&>(local_28);
  local_58 = toCharSequence<kj::String&>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}